

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
diligent_spirv_cross::CompilerGLSL::flags_to_qualifiers_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,Bitset *flags)

{
  byte bVar1;
  BaseType BVar2;
  const_iterator cVar3;
  key_type_conflict local_2c;
  
  local_2c = 0x14eb;
  cVar3 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(flags->higher)._M_h,&local_2c);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (cVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    BVar2 = type->basetype;
    if (((BVar2 - Half < 3) && ((flags->lower & 0x40000000000) != 0)) &&
       ((this->backend).support_precise_qualifier == true)) {
      ::std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x91fa1a);
      BVar2 = type->basetype;
    }
    if ((BVar2 < AccelerationStructure) &&
       ((0x72180U >> (BVar2 & (MeshGridProperties|Int)) & 1) != 0)) {
      if ((this->options).es == true) {
        Compiler::get_entry_point(&this->super_Compiler);
        if (type->basetype == UInt) {
          if (((this->options).es == true) && ((this->options).version < 300)) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            return __return_storage_ptr__;
          }
          bVar1 = (byte)flags->lower;
        }
        else {
          bVar1 = (byte)flags->lower;
        }
        if ((bVar1 & 1) == 0) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      else if (((this->backend).allow_precision_qualifiers == true) && ((flags->lower & 1) != 0)) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
  }
  else {
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"restrict ","");
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::flags_to_qualifiers_glsl(const SPIRType &type, const Bitset &flags)
{
	// GL_EXT_buffer_reference variables can be marked as restrict.
	if (flags.get(DecorationRestrictPointerEXT))
		return "restrict ";

	string qual;

	if (type_is_floating_point(type) && flags.get(DecorationNoContraction) && backend.support_precise_qualifier)
		qual = "precise ";

	// Structs do not have precision qualifiers, neither do doubles (desktop only anyways, so no mediump/highp).
	bool type_supports_precision =
			type.basetype == SPIRType::Float || type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt ||
			type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
			type.basetype == SPIRType::Sampler;

	if (!type_supports_precision)
		return qual;

	if (options.es)
	{
		auto &execution = get_entry_point();

		if (type.basetype == SPIRType::UInt && is_legacy_es())
		{
			// HACK: This is a bool. See comment in type_to_glsl().
			qual += "lowp ";
		}
		else if (flags.get(DecorationRelaxedPrecision))
		{
			bool implied_fmediump = type.basetype == SPIRType::Float &&
			                        options.fragment.default_float_precision == Options::Mediump &&
			                        execution.model == ExecutionModelFragment;

			bool implied_imediump = (type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt) &&
			                        options.fragment.default_int_precision == Options::Mediump &&
			                        execution.model == ExecutionModelFragment;

			qual += (implied_fmediump || implied_imediump) ? "" : "mediump ";
		}
		else
		{
			bool implied_fhighp =
			    type.basetype == SPIRType::Float && ((options.fragment.default_float_precision == Options::Highp &&
			                                          execution.model == ExecutionModelFragment) ||
			                                         (execution.model != ExecutionModelFragment));

			bool implied_ihighp = (type.basetype == SPIRType::Int || type.basetype == SPIRType::UInt) &&
			                      ((options.fragment.default_int_precision == Options::Highp &&
			                        execution.model == ExecutionModelFragment) ||
			                       (execution.model != ExecutionModelFragment));

			qual += (implied_fhighp || implied_ihighp) ? "" : "highp ";
		}
	}
	else if (backend.allow_precision_qualifiers)
	{
		// Vulkan GLSL supports precision qualifiers, even in desktop profiles, which is convenient.
		// The default is highp however, so only emit mediump in the rare case that a shader has these.
		if (flags.get(DecorationRelaxedPrecision))
			qual += "mediump ";
	}

	return qual;
}